

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O0

void __thiscall RenX::LadderDatabase::append(LadderDatabase *this,Entry *entry)

{
  Entry *entry_local;
  LadderDatabase *this_local;
  
  this->m_entries = this->m_entries + 1;
  if (this->m_head == (Entry *)0x0) {
    this->m_head = entry;
    this->m_end = this->m_head;
  }
  else {
    this->m_end->next = entry;
    entry->prev = this->m_end;
    this->m_end = entry;
  }
  return;
}

Assistant:

void RenX::LadderDatabase::append(Entry *entry) {
	++m_entries;
	if (m_head == nullptr) {
		m_head = entry;
		m_end = m_head;
		return;
	}
	m_end->next = entry;
	entry->prev = m_end;
	m_end = entry;
}